

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet-test.c
# Opt level: O1

char * append(char *original,char *append)

{
  size_t sVar1;
  char *pcVar2;
  long lVar3;
  
  if (original == (char *)0x0) {
    lVar3 = 1;
  }
  else {
    sVar1 = strlen(original);
    lVar3 = sVar1 + 1;
  }
  sVar1 = strlen(append);
  pcVar2 = (char *)malloc(lVar3 + sVar1);
  *pcVar2 = '\0';
  if (original != (char *)0x0) {
    strcpy(pcVar2,original);
    free(original);
  }
  pcVar2 = strcat(pcVar2,append);
  return pcVar2;
}

Assistant:

static char *append(char *original, const char *append) {
	size_t olen, alen;
	char *dest;
	
	olen = original != NULL ? strlen(original) : 0;
	alen = strlen(append);

	dest = (char *)malloc(olen + alen + 1);
	dest[0] = '\0';

	if (original != NULL) {
		strcpy(dest, original);

		free(original);
	}

	strcat(dest, append);
	return dest;
}